

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test::testBody
          (TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString SStack_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"func");
  (*pMVar3->_vptr_MockSupport[5])(pMVar3,2,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"func");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x188))((long *)CONCAT44(extraout_var,iVar1))
  ;
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])(pMVar3);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar2 & 0xff),"CHECK","mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x52,pTVar5);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x27])(pMVar3);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockCallTest, expectAMultiCallThatDoesntHappenTheExpectedTimes)
{
    mock().expectNCalls(2, "func");
    MockCheckedActualCall& actualCall = (MockCheckedActualCall&) mock().actualCall("func");
    actualCall.checkExpectations();
    CHECK(mock().expectedCallsLeft());
    mock().clear();
}